

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSVIWriterHandlers.cpp
# Opt level: O0

void __thiscall
PSVIWriterHandlers::sendReference(PSVIWriterHandlers *this,XMLCh *elementName,XSObject *obj)

{
  BaseRefVectorOf<char16_t> *this_00;
  XMLCh *toAdd;
  XSObject *obj_local;
  XMLCh *elementName_local;
  PSVIWriterHandlers *this_local;
  
  if (obj == (XSObject *)0x0) {
    sendElementEmpty(this,elementName);
  }
  else {
    (*(this->fAttrList->super_BaseRefVectorOf<char16_t>)._vptr_BaseRefVectorOf[3])();
    xercesc_4_0::BaseRefVectorOf<char16_t>::addElement
              (&this->fAttrList->super_BaseRefVectorOf<char16_t>,L"ref");
    this_00 = &this->fAttrList->super_BaseRefVectorOf<char16_t>;
    toAdd = getIdName(this,obj);
    xercesc_4_0::BaseRefVectorOf<char16_t>::addElement(this_00,toAdd);
    xercesc_4_0::BaseRefVectorOf<char16_t>::addElement
              (&this->fAttrList->super_BaseRefVectorOf<char16_t>,L"xsi:nil");
    xercesc_4_0::BaseRefVectorOf<char16_t>::addElement
              (&this->fAttrList->super_BaseRefVectorOf<char16_t>,
               (char16_t *)&xercesc_4_0::PSVIUni::fgTrue);
    writeEmpty(this,elementName,this->fAttrList);
  }
  return;
}

Assistant:

void PSVIWriterHandlers::sendReference(const XMLCh* elementName, XSObject* obj) {
	if (obj==NULL) {
		sendElementEmpty(elementName);
	} else {
		fAttrList->removeAllElements();
		fAttrList->addElement((XMLCh*)gRef);
		fAttrList->addElement((XMLCh*)getIdName(obj));
		fAttrList->addElement((XMLCh*)fgXsiNil);
		fAttrList->addElement((XMLCh*)PSVIUni::fgTrue);
		writeEmpty(elementName, fAttrList);
	}
}